

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O1

exr_result_t exr_finish(exr_context_t *pctxt)

{
  byte bVar1;
  exr_context_t ctxt;
  _func_exr_result_t_exr_const_context_t_exr_result_t_char_ptr_varargs *p_Var2;
  int iVar3;
  exr_result_t eVar4;
  char *pcVar5;
  
  if (pctxt == (exr_context_t *)0x0) {
    return 2;
  }
  ctxt = *pctxt;
  if (ctxt == (exr_context_t)0x0) {
    eVar4 = 0;
    goto LAB_00118ed3;
  }
  bVar1 = ctxt->mode - 1;
  eVar4 = 0;
  if ((ctxt->mode & 0xfb) != 0) {
    if ((bVar1 & 0xfd) == 0) {
      if (ctxt->destroy_fn == default_shutdown) {
        pcVar5 = (ctxt->tmp_filename).str;
        if (pcVar5 == (char *)0x0) {
          pcVar5 = (ctxt->filename).str;
        }
        unlink(pcVar5);
      }
    }
    else {
      pcVar5 = (ctxt->tmp_filename).str;
      if ((pcVar5 != (char *)0x0) && (iVar3 = rename(pcVar5,(ctxt->filename).str), iVar3 < 0)) {
        p_Var2 = ctxt->print_error;
        pcVar5 = strerror(0);
        eVar4 = (*p_Var2)(ctxt,5,"Unable to rename temporary file: %s",pcVar5);
        goto LAB_00118eae;
      }
    }
    eVar4 = 0;
  }
LAB_00118eae:
  if (ctxt->destroy_fn != (exr_destroy_stream_func_ptr_t)0x0) {
    (*ctxt->destroy_fn)(ctxt,ctxt->user_data,(uint)((bVar1 & 0xfd) == 0));
  }
  internal_exr_destroy_context(ctxt);
LAB_00118ed3:
  *pctxt = (exr_context_t)0x0;
  return eVar4;
}

Assistant:

exr_result_t
exr_finish (exr_context_t* pctxt)
{
    exr_context_t ctxt;
    exr_result_t  rv = EXR_ERR_SUCCESS;

    if (!pctxt) return EXR_ERR_MISSING_CONTEXT_ARG;

    ctxt = *pctxt;
    if (ctxt)
    {
        int failed = 0;
        if (ctxt->mode == EXR_CONTEXT_WRITE ||
            ctxt->mode == EXR_CONTEXT_WRITING_DATA)
            failed = 1;

        if (ctxt->mode != EXR_CONTEXT_READ &&
            ctxt->mode != EXR_CONTEXT_TEMPORARY)
            rv = finalize_write (ctxt, failed);

        if (ctxt->destroy_fn) ctxt->destroy_fn (ctxt, ctxt->user_data, failed);

        internal_exr_destroy_context (ctxt);
    }
    *pctxt = NULL;

    return rv;
}